

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FIReader.cpp
# Opt level: O0

void __thiscall Assimp::CFIReaderImpl::parseHeader(CFIReaderImpl *this)

{
  byte bVar1;
  byte bVar2;
  byte *pbVar3;
  char **ppcVar4;
  size_t sVar5;
  shared_ptr<const_Assimp::FIValue> *psVar6;
  FIQName *pFVar7;
  bool bVar8;
  DeadlyImportError *pDVar9;
  pointer ppVar10;
  undefined1 local_410 [24];
  undefined1 local_3f8 [7];
  uint8_t b1_3;
  byte local_3d2;
  byte local_3d1;
  undefined1 local_3d0 [6];
  uint8_t b1_2;
  uint8_t b1_1;
  pointer local_370;
  size_t len_12;
  pointer local_308;
  size_t len_11;
  pointer local_2f0;
  size_t len_10;
  pointer local_2d8;
  size_t len_9;
  pointer local_2c0;
  size_t len_8;
  pointer local_298;
  size_t len_7;
  pointer local_270;
  size_t len_6;
  undefined8 local_248;
  size_t len_5;
  _Base_ptr local_220;
  size_t len_4;
  _Base_ptr local_1f8;
  size_t len_3;
  pointer local_1d0;
  size_t len_2;
  pointer local_1a8;
  size_t len_1;
  pointer local_198;
  pointer local_190;
  pointer local_188;
  pointer local_180;
  pointer local_178;
  _Elt_pointer local_170;
  _Elt_pointer local_168;
  _Elt_pointer local_160;
  _Elt_pointer local_158;
  _Elt_pointer local_150;
  _Elt_pointer local_148;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_8
  local_140;
  _Elt_pointer local_130;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_8
  local_128;
  _Base_ptr local_118;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_8
  local_110;
  _Base_ptr local_100;
  _Base_ptr local_f8;
  _Base_ptr local_f0;
  _Base_ptr local_e8;
  FIVocabulary *local_e0;
  FIVocabulary *externalVocabulary;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d0;
  _Self local_b0;
  _Self local_a8;
  iterator it;
  string uri;
  undefined1 local_78 [6];
  uint16_t b1;
  string local_58;
  ulong local_38;
  size_t i;
  size_t len;
  uint8_t b;
  size_t local_18;
  size_t magicSize;
  CFIReaderImpl *this_local;
  
  magicSize = (size_t)this;
  local_18 = parseMagic(this->dataP,this->dataEnd);
  if (local_18 == 0) {
    pDVar9 = (DeadlyImportError *)__cxa_allocate_exception(0x10);
    DeadlyImportError::DeadlyImportError(pDVar9,(string *)parseErrorMessage_abi_cxx11_);
    __cxa_throw(pDVar9,&DeadlyImportError::typeinfo,DeadlyImportError::~DeadlyImportError);
  }
  this->dataP = this->dataP + local_18;
  if ((long)this->dataEnd - (long)this->dataP < 1) {
    pDVar9 = (DeadlyImportError *)__cxa_allocate_exception(0x10);
    DeadlyImportError::DeadlyImportError(pDVar9,(string *)parseErrorMessage_abi_cxx11_);
    __cxa_throw(pDVar9,&DeadlyImportError::typeinfo,DeadlyImportError::~DeadlyImportError);
  }
  pbVar3 = this->dataP;
  this->dataP = pbVar3 + 1;
  len._3_1_ = *pbVar3;
  if ((len._3_1_ & 0x40) != 0) {
    i = parseSequenceLen(this);
    for (local_38 = 0; local_38 < i; local_38 = local_38 + 1) {
      if ((long)this->dataEnd - (long)this->dataP < 1) {
        pDVar9 = (DeadlyImportError *)__cxa_allocate_exception(0x10);
        DeadlyImportError::DeadlyImportError(pDVar9,(string *)parseErrorMessage_abi_cxx11_);
        __cxa_throw(pDVar9,&DeadlyImportError::typeinfo,DeadlyImportError::~DeadlyImportError);
      }
      parseNonEmptyOctetString2_abi_cxx11_(&local_58,this);
      std::__cxx11::string::~string((string *)&local_58);
      if ((long)this->dataEnd - (long)this->dataP < 1) {
        pDVar9 = (DeadlyImportError *)__cxa_allocate_exception(0x10);
        DeadlyImportError::DeadlyImportError(pDVar9,(string *)parseErrorMessage_abi_cxx11_);
        __cxa_throw(pDVar9,&DeadlyImportError::typeinfo,DeadlyImportError::~DeadlyImportError);
      }
      parseNonEmptyOctetString2_abi_cxx11_((string *)local_78,this);
      std::__cxx11::string::~string((string *)local_78);
    }
  }
  if ((len._3_1_ & 0x20) != 0) {
    if ((long)this->dataEnd - (long)this->dataP < 2) {
      pDVar9 = (DeadlyImportError *)__cxa_allocate_exception(0x10);
      DeadlyImportError::DeadlyImportError(pDVar9,(string *)parseErrorMessage_abi_cxx11_);
      __cxa_throw(pDVar9,&DeadlyImportError::typeinfo,DeadlyImportError::~DeadlyImportError);
    }
    bVar1 = *this->dataP;
    bVar2 = this->dataP[1];
    this->dataP = this->dataP + 2;
    if ((bVar1 & 0x10) != 0) {
      if ((long)this->dataEnd - (long)this->dataP < 1) {
        pDVar9 = (DeadlyImportError *)__cxa_allocate_exception(0x10);
        DeadlyImportError::DeadlyImportError(pDVar9,(string *)parseErrorMessage_abi_cxx11_);
        __cxa_throw(pDVar9,&DeadlyImportError::typeinfo,DeadlyImportError::~DeadlyImportError);
      }
      parseNonEmptyOctetString2_abi_cxx11_((string *)&it,this);
      local_a8._M_node =
           (_Base_ptr)
           std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_Assimp::FIVocabulary_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_Assimp::FIVocabulary_*>_>_>
           ::find(&this->vocabularyMap,(string *)&it);
      local_b0._M_node =
           (_Base_ptr)
           std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_Assimp::FIVocabulary_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_Assimp::FIVocabulary_*>_>_>
           ::end(&this->vocabularyMap);
      bVar8 = std::operator==(&local_a8,&local_b0);
      if (bVar8) {
        externalVocabulary._7_1_ = 1;
        pDVar9 = (DeadlyImportError *)__cxa_allocate_exception(0x10);
        std::operator+(&local_d0,"Unknown vocabulary ",
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&it);
        DeadlyImportError::DeadlyImportError(pDVar9,&local_d0);
        externalVocabulary._7_1_ = 0;
        __cxa_throw(pDVar9,&DeadlyImportError::typeinfo,DeadlyImportError::~DeadlyImportError);
      }
      ppVar10 = std::
                _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_Assimp::FIVocabulary_*>_>
                ::operator->(&local_a8);
      local_e0 = ppVar10->second;
      if (local_e0->restrictedAlphabetTable != (char **)0x0) {
        ppcVar4 = local_e0->restrictedAlphabetTable;
        sVar5 = local_e0->restrictedAlphabetTableSize;
        local_e8 = (_Base_ptr)
                   std::
                   back_inserter<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
                             (&(this->vocabulary).restrictedAlphabetTable);
        local_f0 = (_Base_ptr)
                   std::
                   copy<char_const**,std::back_insert_iterator<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>
                             (ppcVar4,ppcVar4 + sVar5,
                              (back_insert_iterator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                               )local_e8);
      }
      if (local_e0->encodingAlgorithmTable != (char **)0x0) {
        ppcVar4 = local_e0->encodingAlgorithmTable;
        sVar5 = local_e0->encodingAlgorithmTableSize;
        local_f8 = (_Base_ptr)
                   std::
                   back_inserter<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
                             (&(this->vocabulary).encodingAlgorithmTable);
        local_100 = (_Base_ptr)
                    std::
                    copy<char_const**,std::back_insert_iterator<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>
                              (ppcVar4,ppcVar4 + sVar5,
                               (back_insert_iterator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                )local_f8);
      }
      if (local_e0->prefixTable != (char **)0x0) {
        ppcVar4 = local_e0->prefixTable;
        sVar5 = local_e0->prefixTableSize;
        local_110._8_8_ =
             std::
             back_inserter<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
                       (&(this->vocabulary).prefixTable);
        local_110._M_allocated_capacity =
             (size_type)
             std::
             copy<char_const**,std::back_insert_iterator<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>
                       (ppcVar4,ppcVar4 + sVar5,local_110._8_8_);
      }
      if (local_e0->namespaceNameTable != (char **)0x0) {
        ppcVar4 = local_e0->namespaceNameTable;
        sVar5 = local_e0->namespaceNameTableSize;
        local_118 = (_Base_ptr)
                    std::
                    back_inserter<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
                              (&(this->vocabulary).namespaceNameTable);
        local_128._8_8_ =
             std::
             copy<char_const**,std::back_insert_iterator<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>
                       (ppcVar4,ppcVar4 + sVar5,
                        (back_insert_iterator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                         )local_118);
      }
      if (local_e0->localNameTable != (char **)0x0) {
        ppcVar4 = local_e0->localNameTable;
        sVar5 = local_e0->localNameTableSize;
        local_128._M_allocated_capacity =
             (size_type)
             std::
             back_inserter<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
                       (&(this->vocabulary).localNameTable);
        local_130 = (_Elt_pointer)
                    std::
                    copy<char_const**,std::back_insert_iterator<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>
                              (ppcVar4,ppcVar4 + sVar5,
                               (back_insert_iterator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                )local_128._M_allocated_capacity);
      }
      if (local_e0->otherNCNameTable != (char **)0x0) {
        ppcVar4 = local_e0->otherNCNameTable;
        sVar5 = local_e0->otherNCNameTableSize;
        local_140._8_8_ =
             std::
             back_inserter<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
                       (&(this->vocabulary).otherNCNameTable);
        local_140._M_allocated_capacity =
             (size_type)
             std::
             copy<char_const**,std::back_insert_iterator<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>
                       (ppcVar4,ppcVar4 + sVar5,local_140._8_8_);
      }
      if (local_e0->otherURITable != (char **)0x0) {
        ppcVar4 = local_e0->otherURITable;
        sVar5 = local_e0->otherURITableSize;
        local_148 = (_Elt_pointer)
                    std::
                    back_inserter<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
                              (&(this->vocabulary).otherURITable);
        local_150 = (_Elt_pointer)
                    std::
                    copy<char_const**,std::back_insert_iterator<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>
                              (ppcVar4,ppcVar4 + sVar5,
                               (back_insert_iterator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                )local_148);
      }
      if (local_e0->attributeValueTable != (shared_ptr<const_Assimp::FIValue> *)0x0) {
        psVar6 = local_e0->attributeValueTable;
        sVar5 = local_e0->attributeValueTableSize;
        local_158 = (_Elt_pointer)
                    std::
                    back_inserter<std::vector<std::shared_ptr<Assimp::FIValue_const>,std::allocator<std::shared_ptr<Assimp::FIValue_const>>>>
                              (&(this->vocabulary).attributeValueTable);
        local_160 = (_Elt_pointer)
                    std::
                    copy<std::shared_ptr<Assimp::FIValue_const>const*,std::back_insert_iterator<std::vector<std::shared_ptr<Assimp::FIValue_const>,std::allocator<std::shared_ptr<Assimp::FIValue_const>>>>>
                              (psVar6,psVar6 + sVar5,
                               (back_insert_iterator<std::vector<std::shared_ptr<const_Assimp::FIValue>,_std::allocator<std::shared_ptr<const_Assimp::FIValue>_>_>_>
                                )local_158);
      }
      if (local_e0->charactersTable != (shared_ptr<const_Assimp::FIValue> *)0x0) {
        psVar6 = local_e0->charactersTable;
        sVar5 = local_e0->charactersTableSize;
        local_168 = (_Elt_pointer)
                    std::
                    back_inserter<std::vector<std::shared_ptr<Assimp::FIValue_const>,std::allocator<std::shared_ptr<Assimp::FIValue_const>>>>
                              (&(this->vocabulary).charactersTable);
        local_170 = (_Elt_pointer)
                    std::
                    copy<std::shared_ptr<Assimp::FIValue_const>const*,std::back_insert_iterator<std::vector<std::shared_ptr<Assimp::FIValue_const>,std::allocator<std::shared_ptr<Assimp::FIValue_const>>>>>
                              (psVar6,psVar6 + sVar5,
                               (back_insert_iterator<std::vector<std::shared_ptr<const_Assimp::FIValue>,_std::allocator<std::shared_ptr<const_Assimp::FIValue>_>_>_>
                                )local_168);
      }
      if (local_e0->otherStringTable != (shared_ptr<const_Assimp::FIValue> *)0x0) {
        psVar6 = local_e0->otherStringTable;
        sVar5 = local_e0->otherStringTableSize;
        local_178 = (pointer)std::
                             back_inserter<std::vector<std::shared_ptr<Assimp::FIValue_const>,std::allocator<std::shared_ptr<Assimp::FIValue_const>>>>
                                       (&(this->vocabulary).otherStringTable);
        local_180 = (pointer)std::
                             copy<std::shared_ptr<Assimp::FIValue_const>const*,std::back_insert_iterator<std::vector<std::shared_ptr<Assimp::FIValue_const>,std::allocator<std::shared_ptr<Assimp::FIValue_const>>>>>
                                       (psVar6,psVar6 + sVar5,
                                        (back_insert_iterator<std::vector<std::shared_ptr<const_Assimp::FIValue>,_std::allocator<std::shared_ptr<const_Assimp::FIValue>_>_>_>
                                         )local_178);
      }
      if (local_e0->elementNameTable != (FIQName *)0x0) {
        pFVar7 = local_e0->elementNameTable;
        sVar5 = local_e0->elementNameTableSize;
        local_188 = (pointer)std::
                             back_inserter<std::vector<Assimp::CFIReaderImpl::QName,std::allocator<Assimp::CFIReaderImpl::QName>>>
                                       (&(this->vocabulary).elementNameTable);
        local_190 = (pointer)std::
                             copy<Assimp::FIQName_const*,std::back_insert_iterator<std::vector<Assimp::CFIReaderImpl::QName,std::allocator<Assimp::CFIReaderImpl::QName>>>>
                                       (pFVar7,pFVar7 + sVar5,
                                        (back_insert_iterator<std::vector<Assimp::CFIReaderImpl::QName,_std::allocator<Assimp::CFIReaderImpl::QName>_>_>
                                         )local_188);
      }
      if (local_e0->attributeNameTable != (FIQName *)0x0) {
        pFVar7 = local_e0->attributeNameTable;
        sVar5 = local_e0->attributeNameTableSize;
        local_198 = (pointer)std::
                             back_inserter<std::vector<Assimp::CFIReaderImpl::QName,std::allocator<Assimp::CFIReaderImpl::QName>>>
                                       (&(this->vocabulary).attributeNameTable);
        len_1 = (size_t)std::
                        copy<Assimp::FIQName_const*,std::back_insert_iterator<std::vector<Assimp::CFIReaderImpl::QName,std::allocator<Assimp::CFIReaderImpl::QName>>>>
                                  (pFVar7,pFVar7 + sVar5,
                                   (back_insert_iterator<std::vector<Assimp::CFIReaderImpl::QName,_std::allocator<Assimp::CFIReaderImpl::QName>_>_>
                                    )local_198);
      }
      std::__cxx11::string::~string((string *)&it);
    }
    if ((bVar1 & 8) != 0) {
      for (local_1a8 = (pointer)parseSequenceLen(this); local_1a8 != (pointer)0x0;
          local_1a8 = (pointer)((long)&local_1a8[-1].value.
                                       super___shared_ptr<const_Assimp::FIValue,_(__gnu_cxx::_Lock_policy)2>
                                       ._M_refcount._M_pi + 7)) {
        if ((long)this->dataEnd - (long)this->dataP < 1) {
          pDVar9 = (DeadlyImportError *)__cxa_allocate_exception(0x10);
          DeadlyImportError::DeadlyImportError(pDVar9,(string *)parseErrorMessage_abi_cxx11_);
          __cxa_throw(pDVar9,&DeadlyImportError::typeinfo,DeadlyImportError::~DeadlyImportError);
        }
        parseNonEmptyOctetString2_abi_cxx11_((string *)&len_2,this);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::push_back(&(this->vocabulary).restrictedAlphabetTable,(string *)&len_2);
        std::__cxx11::string::~string((string *)&len_2);
      }
    }
    if ((bVar1 & 4) != 0) {
      for (local_1d0 = (pointer)parseSequenceLen(this); local_1d0 != (pointer)0x0;
          local_1d0 = (pointer)((long)&local_1d0[-1].name.field_2 + 0xf)) {
        if ((long)this->dataEnd - (long)this->dataP < 1) {
          pDVar9 = (DeadlyImportError *)__cxa_allocate_exception(0x10);
          DeadlyImportError::DeadlyImportError(pDVar9,(string *)parseErrorMessage_abi_cxx11_);
          __cxa_throw(pDVar9,&DeadlyImportError::typeinfo,DeadlyImportError::~DeadlyImportError);
        }
        parseNonEmptyOctetString2_abi_cxx11_((string *)&len_3,this);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::push_back(&(this->vocabulary).encodingAlgorithmTable,(string *)&len_3);
        std::__cxx11::string::~string((string *)&len_3);
      }
    }
    if ((bVar1 & 2) != 0) {
      for (local_1f8 = (_Base_ptr)parseSequenceLen(this); local_1f8 != (_Base_ptr)0x0;
          local_1f8 = (_Base_ptr)((long)&local_1f8[-1]._M_right + 7)) {
        if ((long)this->dataEnd - (long)this->dataP < 1) {
          pDVar9 = (DeadlyImportError *)__cxa_allocate_exception(0x10);
          DeadlyImportError::DeadlyImportError(pDVar9,(string *)parseErrorMessage_abi_cxx11_);
          __cxa_throw(pDVar9,&DeadlyImportError::typeinfo,DeadlyImportError::~DeadlyImportError);
        }
        parseNonEmptyOctetString2_abi_cxx11_((string *)&len_4,this);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::push_back(&(this->vocabulary).prefixTable,(string *)&len_4);
        std::__cxx11::string::~string((string *)&len_4);
      }
    }
    if ((bVar1 & 1) != 0) {
      for (local_220 = (_Base_ptr)parseSequenceLen(this); local_220 != (_Base_ptr)0x0;
          local_220 = (_Base_ptr)((long)&local_220[-1]._M_right + 7)) {
        if ((long)this->dataEnd - (long)this->dataP < 1) {
          pDVar9 = (DeadlyImportError *)__cxa_allocate_exception(0x10);
          DeadlyImportError::DeadlyImportError(pDVar9,(string *)parseErrorMessage_abi_cxx11_);
          __cxa_throw(pDVar9,&DeadlyImportError::typeinfo,DeadlyImportError::~DeadlyImportError);
        }
        parseNonEmptyOctetString2_abi_cxx11_((string *)&len_5,this);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::push_back(&(this->vocabulary).namespaceNameTable,(string *)&len_5);
        std::__cxx11::string::~string((string *)&len_5);
      }
    }
    if ((bVar2 & 0x80) != 0) {
      for (local_248 = parseSequenceLen(this); (pointer)local_248 != (pointer)0x0;
          local_248 = local_248 - 1) {
        if ((long)this->dataEnd - (long)this->dataP < 1) {
          pDVar9 = (DeadlyImportError *)__cxa_allocate_exception(0x10);
          DeadlyImportError::DeadlyImportError(pDVar9,(string *)parseErrorMessage_abi_cxx11_);
          __cxa_throw(pDVar9,&DeadlyImportError::typeinfo,DeadlyImportError::~DeadlyImportError);
        }
        parseNonEmptyOctetString2_abi_cxx11_((string *)&len_6,this);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::push_back(&(this->vocabulary).localNameTable,(string *)&len_6);
        std::__cxx11::string::~string((string *)&len_6);
      }
    }
    if ((bVar2 & 0x40) != 0) {
      for (local_270 = (pointer)parseSequenceLen(this); local_270 != (pointer)0x0;
          local_270 = (pointer)((long)&local_270[-1].field_2 + 0xf)) {
        if ((long)this->dataEnd - (long)this->dataP < 1) {
          pDVar9 = (DeadlyImportError *)__cxa_allocate_exception(0x10);
          DeadlyImportError::DeadlyImportError(pDVar9,(string *)parseErrorMessage_abi_cxx11_);
          __cxa_throw(pDVar9,&DeadlyImportError::typeinfo,DeadlyImportError::~DeadlyImportError);
        }
        parseNonEmptyOctetString2_abi_cxx11_((string *)&len_7,this);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::push_back(&(this->vocabulary).otherNCNameTable,(string *)&len_7);
        std::__cxx11::string::~string((string *)&len_7);
      }
    }
    if ((bVar2 & 0x20) != 0) {
      for (local_298 = (pointer)parseSequenceLen(this); local_298 != (pointer)0x0;
          local_298 = (pointer)((long)&local_298[-1].field_2 + 0xf)) {
        if ((long)this->dataEnd - (long)this->dataP < 1) {
          pDVar9 = (DeadlyImportError *)__cxa_allocate_exception(0x10);
          DeadlyImportError::DeadlyImportError(pDVar9,(string *)parseErrorMessage_abi_cxx11_);
          __cxa_throw(pDVar9,&DeadlyImportError::typeinfo,DeadlyImportError::~DeadlyImportError);
        }
        parseNonEmptyOctetString2_abi_cxx11_((string *)&len_8,this);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::push_back(&(this->vocabulary).otherURITable,(string *)&len_8);
        std::__cxx11::string::~string((string *)&len_8);
      }
    }
    if ((bVar2 & 0x10) != 0) {
      for (local_2c0 = (pointer)parseSequenceLen(this); local_2c0 != (pointer)0x0;
          local_2c0 = (pointer)((long)&local_2c0[-1].value.
                                       super___shared_ptr<const_Assimp::FIValue,_(__gnu_cxx::_Lock_policy)2>
                                       ._M_refcount._M_pi + 7)) {
        if ((long)this->dataEnd - (long)this->dataP < 1) {
          pDVar9 = (DeadlyImportError *)__cxa_allocate_exception(0x10);
          DeadlyImportError::DeadlyImportError(pDVar9,(string *)parseErrorMessage_abi_cxx11_);
          __cxa_throw(pDVar9,&DeadlyImportError::typeinfo,DeadlyImportError::~DeadlyImportError);
        }
        parseEncodedCharacterString3((CFIReaderImpl *)&len_9);
        std::
        vector<std::shared_ptr<const_Assimp::FIValue>,_std::allocator<std::shared_ptr<const_Assimp::FIValue>_>_>
        ::push_back(&(this->vocabulary).attributeValueTable,(value_type *)&len_9);
        std::shared_ptr<const_Assimp::FIValue>::~shared_ptr
                  ((shared_ptr<const_Assimp::FIValue> *)&len_9);
      }
    }
    if ((bVar2 & 8) != 0) {
      for (local_2d8 = (pointer)parseSequenceLen(this); local_2d8 != (pointer)0x0;
          local_2d8 = (pointer)((long)&local_2d8[-1].name.field_2 + 0xf)) {
        if ((long)this->dataEnd - (long)this->dataP < 1) {
          pDVar9 = (DeadlyImportError *)__cxa_allocate_exception(0x10);
          DeadlyImportError::DeadlyImportError(pDVar9,(string *)parseErrorMessage_abi_cxx11_);
          __cxa_throw(pDVar9,&DeadlyImportError::typeinfo,DeadlyImportError::~DeadlyImportError);
        }
        parseEncodedCharacterString3((CFIReaderImpl *)&len_10);
        std::
        vector<std::shared_ptr<const_Assimp::FIValue>,_std::allocator<std::shared_ptr<const_Assimp::FIValue>_>_>
        ::push_back(&(this->vocabulary).charactersTable,(value_type *)&len_10);
        std::shared_ptr<const_Assimp::FIValue>::~shared_ptr
                  ((shared_ptr<const_Assimp::FIValue> *)&len_10);
      }
    }
    if ((bVar2 & 4) != 0) {
      for (local_2f0 = (pointer)parseSequenceLen(this); local_2f0 != (pointer)0x0;
          local_2f0 = (pointer)((long)&local_2f0[-1].name.field_2 + 0xf)) {
        if ((long)this->dataEnd - (long)this->dataP < 1) {
          pDVar9 = (DeadlyImportError *)__cxa_allocate_exception(0x10);
          DeadlyImportError::DeadlyImportError(pDVar9,(string *)parseErrorMessage_abi_cxx11_);
          __cxa_throw(pDVar9,&DeadlyImportError::typeinfo,DeadlyImportError::~DeadlyImportError);
        }
        parseEncodedCharacterString3((CFIReaderImpl *)&len_11);
        std::
        vector<std::shared_ptr<const_Assimp::FIValue>,_std::allocator<std::shared_ptr<const_Assimp::FIValue>_>_>
        ::push_back(&(this->vocabulary).otherStringTable,(value_type *)&len_11);
        std::shared_ptr<const_Assimp::FIValue>::~shared_ptr
                  ((shared_ptr<const_Assimp::FIValue> *)&len_11);
      }
    }
    if ((bVar2 & 2) != 0) {
      for (local_308 = (pointer)parseSequenceLen(this); local_308 != (pointer)0x0;
          local_308 = (pointer)((long)&local_308[-1].
                                       super___shared_ptr<const_Assimp::FIValue,_(__gnu_cxx::_Lock_policy)2>
                                       ._M_refcount._M_pi + 7)) {
        parseNameSurrogate((QName *)&len_12,this);
        std::vector<Assimp::CFIReaderImpl::QName,_std::allocator<Assimp::CFIReaderImpl::QName>_>::
        push_back(&(this->vocabulary).elementNameTable,(QName *)&len_12);
        QName::~QName((QName *)&len_12);
      }
    }
    if ((bVar2 & 1) != 0) {
      for (local_370 = (pointer)parseSequenceLen(this); local_370 != (pointer)0x0;
          local_370 = (pointer)((long)&local_370[-1].field_2 + 0xf)) {
        parseNameSurrogate((QName *)local_3d0,this);
        std::vector<Assimp::CFIReaderImpl::QName,_std::allocator<Assimp::CFIReaderImpl::QName>_>::
        push_back(&(this->vocabulary).attributeNameTable,(QName *)local_3d0);
        QName::~QName((QName *)local_3d0);
      }
    }
  }
  if ((len._3_1_ & 0x10) != 0) {
    while( true ) {
      if ((long)this->dataEnd - (long)this->dataP < 1) {
        pDVar9 = (DeadlyImportError *)__cxa_allocate_exception(0x10);
        DeadlyImportError::DeadlyImportError(pDVar9,(string *)parseErrorMessage_abi_cxx11_);
        __cxa_throw(pDVar9,&DeadlyImportError::typeinfo,DeadlyImportError::~DeadlyImportError);
      }
      pbVar3 = this->dataP;
      this->dataP = pbVar3 + 1;
      local_3d1 = *pbVar3;
      if (local_3d1 == 0xf0) break;
      if ((local_3d1 & 0xfc) != 0xc0) {
        pDVar9 = (DeadlyImportError *)__cxa_allocate_exception(0x10);
        DeadlyImportError::DeadlyImportError(pDVar9,(string *)parseErrorMessage_abi_cxx11_);
        __cxa_throw(pDVar9,&DeadlyImportError::typeinfo,DeadlyImportError::~DeadlyImportError);
      }
      parseIdentifyingStringOrIndex(this,&(this->vocabulary).otherNCNameTable);
      if ((local_3d1 & 2) != 0) {
        parseIdentifyingStringOrIndex(this,&(this->vocabulary).otherURITable);
      }
      if ((local_3d1 & 1) != 0) {
        parseIdentifyingStringOrIndex(this,&(this->vocabulary).otherURITable);
      }
    }
    local_3d1 = 0xf0;
  }
  if ((len._3_1_ & 8) != 0) {
    while( true ) {
      if ((long)this->dataEnd - (long)this->dataP < 1) {
        pDVar9 = (DeadlyImportError *)__cxa_allocate_exception(0x10);
        DeadlyImportError::DeadlyImportError(pDVar9,(string *)parseErrorMessage_abi_cxx11_);
        __cxa_throw(pDVar9,&DeadlyImportError::typeinfo,DeadlyImportError::~DeadlyImportError);
      }
      pbVar3 = this->dataP;
      this->dataP = pbVar3 + 1;
      local_3d2 = *pbVar3;
      if (local_3d2 == 0xf0) break;
      if ((local_3d2 & 0xfe) != 0xd0) {
        pDVar9 = (DeadlyImportError *)__cxa_allocate_exception(0x10);
        DeadlyImportError::DeadlyImportError(pDVar9,(string *)parseErrorMessage_abi_cxx11_);
        __cxa_throw(pDVar9,&DeadlyImportError::typeinfo,DeadlyImportError::~DeadlyImportError);
      }
      parseIdentifyingStringOrIndex(this,&(this->vocabulary).otherNCNameTable);
      parseIdentifyingStringOrIndex(this,&(this->vocabulary).otherURITable);
      if ((local_3d2 & 1) != 0) {
        parseIdentifyingStringOrIndex(this,&(this->vocabulary).otherURITable);
      }
      parseIdentifyingStringOrIndex(this,&(this->vocabulary).otherNCNameTable);
    }
    local_3d2 = 0xf0;
  }
  if ((len._3_1_ & 4) != 0) {
    if ((long)this->dataEnd - (long)this->dataP < 1) {
      pDVar9 = (DeadlyImportError *)__cxa_allocate_exception(0x10);
      DeadlyImportError::DeadlyImportError(pDVar9,(string *)parseErrorMessage_abi_cxx11_);
      __cxa_throw(pDVar9,&DeadlyImportError::typeinfo,DeadlyImportError::~DeadlyImportError);
    }
    parseNonEmptyOctetString2_abi_cxx11_((string *)local_3f8,this);
    std::__cxx11::string::~string((string *)local_3f8);
  }
  if ((len._3_1_ & 2) != 0) {
    if ((long)this->dataEnd - (long)this->dataP < 1) {
      pDVar9 = (DeadlyImportError *)__cxa_allocate_exception(0x10);
      DeadlyImportError::DeadlyImportError(pDVar9,(string *)parseErrorMessage_abi_cxx11_);
      __cxa_throw(pDVar9,&DeadlyImportError::typeinfo,DeadlyImportError::~DeadlyImportError);
    }
    pbVar3 = this->dataP;
    this->dataP = pbVar3 + 1;
    local_410[0x17] = *pbVar3;
    if ((local_410[0x17] & 0xfe) != 0) {
      pDVar9 = (DeadlyImportError *)__cxa_allocate_exception(0x10);
      DeadlyImportError::DeadlyImportError(pDVar9,(string *)parseErrorMessage_abi_cxx11_);
      __cxa_throw(pDVar9,&DeadlyImportError::typeinfo,DeadlyImportError::~DeadlyImportError);
    }
  }
  if ((len._3_1_ & 1) != 0) {
    if ((long)this->dataEnd - (long)this->dataP < 1) {
      pDVar9 = (DeadlyImportError *)__cxa_allocate_exception(0x10);
      DeadlyImportError::DeadlyImportError(pDVar9,(string *)parseErrorMessage_abi_cxx11_);
      __cxa_throw(pDVar9,&DeadlyImportError::typeinfo,DeadlyImportError::~DeadlyImportError);
    }
    parseNonIdentifyingStringOrIndex1
              ((CFIReaderImpl *)local_410,
               (vector<std::shared_ptr<const_Assimp::FIValue>,_std::allocator<std::shared_ptr<const_Assimp::FIValue>_>_>
                *)this);
    std::shared_ptr<const_Assimp::FIValue>::~shared_ptr
              ((shared_ptr<const_Assimp::FIValue> *)local_410);
  }
  return;
}

Assistant:

void parseHeader() {
        // Parse header (C.1.3)
        size_t magicSize = parseMagic(dataP, dataEnd);
        if (!magicSize) {
            throw DeadlyImportError(parseErrorMessage);
        }
        dataP += magicSize;
        // C.2.3
        if (dataEnd - dataP < 1) {
            throw DeadlyImportError(parseErrorMessage);
        }
        uint8_t b = *dataP++;
        if (b & 0x40) {
            // Parse additional data (C.2.4)
            size_t len = parseSequenceLen();
            for (size_t i = 0; i < len; ++i) {
                if (dataEnd - dataP < 1) {
                    throw DeadlyImportError(parseErrorMessage);
                }
                /*std::string id =*/ parseNonEmptyOctetString2();
                if (dataEnd - dataP < 1) {
                    throw DeadlyImportError(parseErrorMessage);
                }
                /*std::string data =*/ parseNonEmptyOctetString2();
            }
        }
        if (b & 0x20) {
            // Parse initial vocabulary (C.2.5)
            if (dataEnd - dataP < 2) {
                throw DeadlyImportError(parseErrorMessage);
            }
            uint16_t b1 = (dataP[0] << 8) | dataP[1];
            dataP += 2;
            if (b1 & 0x1000) {
                // External vocabulary (C.2.5.2)
                if (dataEnd - dataP < 1) {
                    throw DeadlyImportError(parseErrorMessage);
                }
                std::string uri = parseNonEmptyOctetString2();
                auto it = vocabularyMap.find(uri);
                if (it == vocabularyMap.end()) {
                    throw DeadlyImportError("Unknown vocabulary " + uri);
                }
                const FIVocabulary *externalVocabulary = it->second;
                if (externalVocabulary->restrictedAlphabetTable) {
                    std::copy(externalVocabulary->restrictedAlphabetTable, externalVocabulary->restrictedAlphabetTable + externalVocabulary->restrictedAlphabetTableSize, std::back_inserter(vocabulary.restrictedAlphabetTable));
                }
                if (externalVocabulary->encodingAlgorithmTable) {
                    std::copy(externalVocabulary->encodingAlgorithmTable, externalVocabulary->encodingAlgorithmTable + externalVocabulary->encodingAlgorithmTableSize, std::back_inserter(vocabulary.encodingAlgorithmTable));
                }
                if (externalVocabulary->prefixTable) {
                    std::copy(externalVocabulary->prefixTable, externalVocabulary->prefixTable + externalVocabulary->prefixTableSize, std::back_inserter(vocabulary.prefixTable));
                }
                if (externalVocabulary->namespaceNameTable) {
                    std::copy(externalVocabulary->namespaceNameTable, externalVocabulary->namespaceNameTable + externalVocabulary->namespaceNameTableSize, std::back_inserter(vocabulary.namespaceNameTable));
                }
                if (externalVocabulary->localNameTable) {
                    std::copy(externalVocabulary->localNameTable, externalVocabulary->localNameTable + externalVocabulary->localNameTableSize, std::back_inserter(vocabulary.localNameTable));
                }
                if (externalVocabulary->otherNCNameTable) {
                    std::copy(externalVocabulary->otherNCNameTable, externalVocabulary->otherNCNameTable + externalVocabulary->otherNCNameTableSize, std::back_inserter(vocabulary.otherNCNameTable));
                }
                if (externalVocabulary->otherURITable) {
                    std::copy(externalVocabulary->otherURITable, externalVocabulary->otherURITable + externalVocabulary->otherURITableSize, std::back_inserter(vocabulary.otherURITable));
                }
                if (externalVocabulary->attributeValueTable) {
                    std::copy(externalVocabulary->attributeValueTable, externalVocabulary->attributeValueTable + externalVocabulary->attributeValueTableSize, std::back_inserter(vocabulary.attributeValueTable));
                }
                if (externalVocabulary->charactersTable) {
                    std::copy(externalVocabulary->charactersTable, externalVocabulary->charactersTable + externalVocabulary->charactersTableSize, std::back_inserter(vocabulary.charactersTable));
                }
                if (externalVocabulary->otherStringTable) {
                    std::copy(externalVocabulary->otherStringTable, externalVocabulary->otherStringTable + externalVocabulary->otherStringTableSize, std::back_inserter(vocabulary.otherStringTable));
                }
                if (externalVocabulary->elementNameTable) {
                    std::copy(externalVocabulary->elementNameTable, externalVocabulary->elementNameTable + externalVocabulary->elementNameTableSize, std::back_inserter(vocabulary.elementNameTable));
                }
                if (externalVocabulary->attributeNameTable) {
                    std::copy(externalVocabulary->attributeNameTable, externalVocabulary->attributeNameTable + externalVocabulary->attributeNameTableSize, std::back_inserter(vocabulary.attributeNameTable));
                }
            }
            if (b1 & 0x0800) {
                // Parse restricted alphabets (C.2.5.3)
                for (size_t len = parseSequenceLen(); len > 0; --len) {
                    if (dataEnd - dataP < 1) {
                        throw DeadlyImportError(parseErrorMessage);
                    }
                    vocabulary.restrictedAlphabetTable.push_back(parseNonEmptyOctetString2());
                }
            }
            if (b1 & 0x0400) {
                // Parse encoding algorithms (C.2.5.3)
                for (size_t len = parseSequenceLen(); len > 0; --len) {
                    if (dataEnd - dataP < 1) {
                        throw DeadlyImportError(parseErrorMessage);
                    }
                    vocabulary.encodingAlgorithmTable.push_back(parseNonEmptyOctetString2());
                }
            }
            if (b1 & 0x0200) {
                // Parse prefixes (C.2.5.3)
                for (size_t len = parseSequenceLen(); len > 0; --len) {
                    if (dataEnd - dataP < 1) {
                        throw DeadlyImportError(parseErrorMessage);
                    }
                    vocabulary.prefixTable.push_back(parseNonEmptyOctetString2());
                }
            }
            if (b1 & 0x0100) {
                // Parse namespace names (C.2.5.3)
                for (size_t len = parseSequenceLen(); len > 0; --len) {
                    if (dataEnd - dataP < 1) {
                        throw DeadlyImportError(parseErrorMessage);
                    }
                    vocabulary.namespaceNameTable.push_back(parseNonEmptyOctetString2());
                }
            }
            if (b1 & 0x0080) {
                // Parse local names (C.2.5.3)
                for (size_t len = parseSequenceLen(); len > 0; --len) {
                    if (dataEnd - dataP < 1) {
                        throw DeadlyImportError(parseErrorMessage);
                    }
                    vocabulary.localNameTable.push_back(parseNonEmptyOctetString2());
                }
            }
            if (b1 & 0x0040) {
                // Parse other ncnames (C.2.5.3)
                for (size_t len = parseSequenceLen(); len > 0; --len) {
                    if (dataEnd - dataP < 1) {
                        throw DeadlyImportError(parseErrorMessage);
                    }
                    vocabulary.otherNCNameTable.push_back(parseNonEmptyOctetString2());
                }
            }
            if (b1 & 0x0020) {
                // Parse other uris (C.2.5.3)
                for (size_t len = parseSequenceLen(); len > 0; --len) {
                    if (dataEnd - dataP < 1) {
                        throw DeadlyImportError(parseErrorMessage);
                    }
                    vocabulary.otherURITable.push_back(parseNonEmptyOctetString2());
                }
            }
            if (b1 & 0x0010) {
                // Parse attribute values (C.2.5.4)
                for (size_t len = parseSequenceLen(); len > 0; --len) {
                    if (dataEnd - dataP < 1) {
                        throw DeadlyImportError(parseErrorMessage);
                    }
                    vocabulary.attributeValueTable.push_back(parseEncodedCharacterString3());
                }
            }
            if (b1 & 0x0008) {
                // Parse content character chunks (C.2.5.4)
                for (size_t len = parseSequenceLen(); len > 0; --len) {
                    if (dataEnd - dataP < 1) {
                        throw DeadlyImportError(parseErrorMessage);
                    }
                    vocabulary.charactersTable.push_back(parseEncodedCharacterString3());
                }
            }
            if (b1 & 0x0004) {
                // Parse other strings (C.2.5.4)
                for (size_t len = parseSequenceLen(); len > 0; --len) {
                    if (dataEnd - dataP < 1) {
                        throw DeadlyImportError(parseErrorMessage);
                    }
                    vocabulary.otherStringTable.push_back(parseEncodedCharacterString3());
                }
            }
            if (b1 & 0x0002) {
                // Parse element name surrogates (C.2.5.5)
                for (size_t len = parseSequenceLen(); len > 0; --len) {
                    vocabulary.elementNameTable.push_back(parseNameSurrogate());
                }
            }
            if (b1 & 0x0001) {
                // Parse attribute name surrogates (C.2.5.5)
                for (size_t len = parseSequenceLen(); len > 0; --len) {
                    vocabulary.attributeNameTable.push_back(parseNameSurrogate());
                }
            }
        }
        if (b & 0x10) {
            // Parse notations (C.2.6)
            for (;;) {
                if (dataEnd - dataP < 1) {
                    throw DeadlyImportError(parseErrorMessage);
                }
                uint8_t b1 = *dataP++;
                if (b1 == 0xf0) {
                    break;
                }
                if ((b1 & 0xfc) != 0xc0) {
                    throw DeadlyImportError(parseErrorMessage);
                }
                /* C.11 */
                /*const std::string &name =*/ parseIdentifyingStringOrIndex(vocabulary.otherNCNameTable);
                if (b1 & 0x02) {
                    /*const std::string &systemId =*/ parseIdentifyingStringOrIndex(vocabulary.otherURITable);
                }
                if (b1 & 0x01) {
                    /*const std::string &publicId =*/ parseIdentifyingStringOrIndex(vocabulary.otherURITable);
                }
            }
        }
        if (b & 0x08) {
            // Parse unparsed entities (C.2.7)
            for (;;) {
                if (dataEnd - dataP < 1) {
                    throw DeadlyImportError(parseErrorMessage);
                }
                uint8_t b1 = *dataP++;
                if (b1 == 0xf0) {
                    break;
                }
                if ((b1 & 0xfe) != 0xd0) {
                    throw DeadlyImportError(parseErrorMessage);
                }
                /* C.10 */
                /*const std::string &name =*/ parseIdentifyingStringOrIndex(vocabulary.otherNCNameTable);
                /*const std::string &systemId =*/ parseIdentifyingStringOrIndex(vocabulary.otherURITable);
                if (b1 & 0x01) {
                    /*const std::string &publicId =*/ parseIdentifyingStringOrIndex(vocabulary.otherURITable);
                }
                /*const std::string &notationName =*/ parseIdentifyingStringOrIndex(vocabulary.otherNCNameTable);
            }
        }
        if (b & 0x04) {
            // Parse character encoding scheme (C.2.8)
            if (dataEnd - dataP < 1) {
                throw DeadlyImportError(parseErrorMessage);
            }
            /*std::string characterEncodingScheme =*/ parseNonEmptyOctetString2();
        }
        if (b & 0x02) {
            // Parse standalone flag (C.2.9)
            if (dataEnd - dataP < 1) {
                throw DeadlyImportError(parseErrorMessage);
            }
            uint8_t b1 = *dataP++;
            if (b1 & 0xfe) {
                throw DeadlyImportError(parseErrorMessage);
            }
            //bool standalone = b1 & 0x01;
        }
        if (b & 0x01) {
            // Parse version (C.2.10)
            if (dataEnd - dataP < 1) {
                throw DeadlyImportError(parseErrorMessage);
            }
            /*std::shared_ptr<const FIValue> version =*/ parseNonIdentifyingStringOrIndex1(vocabulary.otherStringTable);
        }
    }